

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O0

void cluster_preprocess(int n,vec3f *positions,int *clusterids,SphereTree *hierarchy,int *sphcnt)

{
  vec3f *b;
  float cluster_radius_00;
  data_t dVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  long lVar5;
  SphereTree *hierarchy_00;
  allocator_type *paVar6;
  pointer pfVar7;
  bool bVar8;
  int *piVar9;
  reference pvVar10;
  reference a;
  vec3f *pvVar11;
  reference pvVar12;
  float *data;
  undefined8 *puVar13;
  reference pvVar14;
  reference pfVar15;
  size_type sVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  vec3f vVar17;
  undefined8 uStack_310;
  undefined4 auStack_308 [2];
  int *piStack_300;
  undefined1 local_2f8 [16];
  float *local_2e8;
  value_type local_2dc;
  float local_2d8;
  float local_2d4;
  long local_2d0;
  float *local_2c8;
  ulong local_2c0;
  SphereTree *local_2b8;
  size_type local_2b0;
  allocator_type *local_2a8;
  pointer local_2a0;
  float *local_298;
  float local_28c;
  float *local_288;
  data_t local_27c;
  reference local_278;
  data_t local_26c;
  undefined1 local_268 [16];
  size_type local_258;
  allocator_type *local_250;
  vec3f *local_248;
  data_t local_23c;
  undefined1 local_238 [16];
  vec3f *local_228;
  vec3f *local_220;
  vec3f *local_218;
  ulong local_210;
  vec3f *local_208;
  vec3f *local_200;
  allocator_type *local_1f8;
  size_type local_1f0;
  size_type local_1e8;
  allocator_type *local_1e0;
  double local_1d8;
  int local_1cc;
  iterator iStack_1c8;
  int t;
  iterator __end1;
  iterator __begin1;
  vector<float,_std::allocator<float>_> *__range1;
  int local_1a8;
  int max;
  int s;
  int recv_3;
  int k;
  int i;
  data_t local_190;
  undefined8 local_188;
  data_t local_180;
  undefined1 local_178 [8];
  vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
  blockers;
  allocator<float> local_155;
  int c_3;
  undefined1 local_150 [8];
  vector<float,_std::allocator<float>_> cluster_blocker_count;
  float *ratiodata;
  float *sphdata;
  vec3f local_118;
  data_t local_10c;
  data_t local_108;
  int local_104;
  int c_2;
  int recv_2;
  undefined1 local_f8 [8];
  vector<float,_std::allocator<float>_> cluster_radius;
  undefined4 uStack_d8;
  data_t local_d4;
  int local_b4;
  int c_1;
  unsigned_long __vla_expr0;
  int local_9c;
  int c;
  int recv_1;
  undefined1 local_88 [8];
  vector<vec3f,_std::allocator<vec3f>_> recv_sum;
  allocator<int> local_5d;
  value_type_conflict5 local_5c;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> recv_cnt;
  int local_38;
  int n_cluster;
  int recv;
  int maxcluster;
  int *sphcnt_local;
  SphereTree *hierarchy_local;
  int *clusterids_local;
  vec3f *positions_local;
  int n_local;
  
  piStack_300 = (int *)0x18db41;
  _recv = sphcnt;
  sphcnt_local = (int *)hierarchy;
  hierarchy_local = (SphereTree *)clusterids;
  clusterids_local = (int *)positions;
  positions_local._4_4_ = n;
  github111116::ConsoleLogger::log<char[26]>(&console,(char (*) [26])"per-cluster processing...");
  n_cluster = 0;
  for (local_38 = 0; local_38 < positions_local._4_4_; local_38 = local_38 + 1) {
    piStack_300 = (int *)0x18db6f;
    piVar9 = std::max<int>(&n_cluster,(int *)(&(hierarchy_local->bound).center.x + local_38));
    n_cluster = *piVar9;
  }
  recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = n_cluster + 1;
  local_1e8 = (size_type)
              (int)recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
  local_5c = 0;
  local_1e0 = &local_5d;
  piStack_300 = (int *)0x18dba9;
  std::allocator<int>::allocator(local_1e0);
  piStack_300 = (int *)0x18dbc4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_58,local_1e8,&local_5c,local_1e0);
  piStack_300 = (int *)0x18dbcf;
  std::allocator<int>::~allocator(&local_5d);
  local_1f0 = (size_type)
              (int)recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
  piStack_300 = (int *)0x18dbe9;
  vec3f::vec3f((vec3f *)&recv_1,0.0);
  local_1f8 = (allocator_type *)((long)&c + 3);
  piStack_300 = (int *)0x18dbfe;
  std::allocator<vec3f>::allocator(local_1f8);
  piStack_300 = (int *)0x18dc1c;
  std::vector<vec3f,_std::allocator<vec3f>_>::vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)local_88,local_1f0,(value_type *)&recv_1,
             local_1f8);
  piStack_300 = (int *)0x18dc2a;
  std::allocator<vec3f>::~allocator((allocator<vec3f> *)((long)&c + 3));
  for (local_9c = 0; local_9c < positions_local._4_4_; local_9c = local_9c + 1) {
    dVar1 = (&(hierarchy_local->bound).center.x)[local_9c];
    piStack_300 = (int *)0x18dc67;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_58,(long)(int)dVar1);
    *pvVar10 = *pvVar10 + 1;
    local_200 = (vec3f *)(clusterids_local + (long)local_9c * 3);
    piStack_300 = (int *)0x18dc97;
    a = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                  ((vector<vec3f,_std::allocator<vec3f>_> *)local_88,(long)(int)dVar1);
    piStack_300 = (int *)0x18dca6;
    operator+=(a,local_200);
  }
  local_210 = (ulong)recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
  lVar5 = -(local_210 * 0xc + 0xf & 0xfffffffffffffff0);
  local_208 = (vec3f *)(local_2f8 + lVar5);
  if (local_210 != 0) {
    local_220 = local_208 + local_210;
    local_218 = local_208;
    do {
      pvVar11 = local_218;
      local_228 = local_218;
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18dd91;
      vec3f::vec3f(pvVar11);
      local_218 = local_228 + 1;
    } while (local_218 != local_220);
  }
  for (local_b4 = 0;
      local_b4 <
      (int)recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_; local_b4 = local_b4 + 1) {
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18ddda;
    local_248 = std::vector<vec3f,_std::allocator<vec3f>_>::operator[]
                          ((vector<vec3f,_std::allocator<vec3f>_> *)local_88,(long)local_b4);
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18ddf1;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_58,(long)local_b4);
    pvVar11 = local_248;
    iVar2 = *pvVar10;
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18de01;
    vVar17 = operator/(pvVar11,(float)iVar2);
    uVar4 = vVar17._0_8_;
    auVar3._8_4_ = extraout_XMM0_Dc;
    auVar3._0_8_ = uVar4;
    auVar3._12_4_ = extraout_XMM0_Dd;
    pvVar11 = local_208 + local_b4;
    pvVar11->x = (data_t)(int)uVar4;
    pvVar11->y = (data_t)(int)((ulong)uVar4 >> 0x20);
    pvVar11->z = vVar17.z;
    local_23c = vVar17.z;
    local_238 = auVar3;
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18de83;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_58,(long)local_b4);
    if (*pvVar10 == 0) {
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18de9b;
      github111116::ConsoleLogger::debug<char[36]>
                (&console,(char (*) [36])"encountering empty receiver cluster");
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18deb2;
      vec3f::vec3f((vec3f *)((long)&cluster_radius.super__Vector_base<float,_std::allocator<float>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0.0,0.0,
                   0.0);
      pvVar11 = local_208 + local_b4;
      pvVar11->x = (data_t)cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar11->y = (data_t)uStack_d8;
      pvVar11->z = local_d4;
    }
  }
  local_258 = (size_type)
              (int)recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
  recv_2 = 0;
  local_250 = (allocator<float> *)((long)&c_2 + 3);
  *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18df1a;
  std::allocator<float>::allocator((allocator<float> *)((long)&c_2 + 3));
  paVar6 = local_250;
  sVar16 = local_258;
  *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18df3b;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,sVar16,(value_type *)&recv_2,paVar6);
  *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18df49;
  std::allocator<float>::~allocator((allocator<float> *)((long)&c_2 + 3));
  for (local_104 = 0; local_104 < positions_local._4_4_; local_104 = local_104 + 1) {
    local_108 = (&(hierarchy_local->bound).center.x)[local_104];
    sVar16 = (size_type)(int)local_108;
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18df89;
    local_278 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_f8,sVar16);
    pvVar11 = (vec3f *)(clusterids_local + (long)local_104 * 3);
    b = local_208 + (int)local_108;
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18dfc1;
    vVar17 = operator-(pvVar11,b);
    local_26c = vVar17.z;
    local_118._0_8_ = vVar17._0_8_;
    local_268._8_4_ = extraout_XMM0_Dc_00;
    local_268._0_4_ = local_118.x;
    local_268._4_4_ = local_118.y;
    local_268._12_4_ = extraout_XMM0_Dd_00;
    local_118.z = local_26c;
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e017;
    local_27c = norm(&local_118);
    pvVar12 = local_278;
    local_10c = local_27c;
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e044;
    local_288 = std::max<float>(pvVar12,&local_10c);
    local_28c = *local_288;
    sVar16 = (size_type)(int)local_108;
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e073;
    pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_f8,sVar16);
    *pvVar12 = local_28c;
  }
  *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e0cb;
  data = (float *)operator_new__(0x1000000);
  local_298 = data;
  *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e0ec;
  local_2a0 = (pointer)operator_new__(0x3c00000);
  local_2b0 = (size_type)
              (int)recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
  c_3 = 0;
  local_2a8 = &local_155;
  cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_2a0;
  *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e12b;
  std::allocator<float>::allocator(&local_155);
  paVar6 = local_2a8;
  sVar16 = local_2b0;
  *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e14c;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_150,sVar16,(value_type *)&c_3,paVar6);
  *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e15a;
  std::allocator<float>::~allocator(&local_155);
  blockers.
  super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    if ((int)recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ <=
        blockers.
        super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e47b;
      (*glad_glActiveTexture)(0x84c4);
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e49e;
      create_2D_float_texture(0x400,0x400,4,data,0x2600,false);
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e4b1;
      (*glad_glActiveTexture)(0x84c5);
      pfVar7 = cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      *(undefined4 *)((long)auStack_308 + lVar5) = 0;
      *(undefined8 *)((long)&uStack_310 + lVar5) = 0x18e4e3;
      create_2D_float_texture_array
                (0x400,0x400,1,0xf,pfVar7,0x2600,*(bool *)((long)auStack_308 + lVar5));
      local_2e8 = data;
      if (data != (float *)0x0) {
        *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e509;
        operator_delete__(data);
      }
      pfVar7 = cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      local_2f8._8_8_ =
           cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      if (cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e529;
        operator_delete__(pfVar7);
      }
      for (max = 0; max < positions_local._4_4_; max = max + 1) {
        dVar1 = (&(hierarchy_local->bound).center.x)[max];
        *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e559;
        pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)local_150,(long)(int)dVar1);
        _recv[max] = (int)*pvVar12;
      }
      local_1a8 = 0;
      __range1._4_4_ = 0;
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e5aa;
      __end1 = std::vector<float,_std::allocator<float>_>::begin
                         ((vector<float,_std::allocator<float>_> *)local_150);
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e5bd;
      iStack_1c8 = std::vector<float,_std::allocator<float>_>::end
                             ((vector<float,_std::allocator<float>_> *)local_150);
      while( true ) {
        *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e5d7;
        bVar8 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffe38);
        if (!bVar8) break;
        *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e5e9;
        pfVar15 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                  ::operator*(&__end1);
        local_1cc = (int)*pfVar15;
        local_1a8 = local_1a8 + local_1cc;
        *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e61a;
        local_2f8._0_8_ = std::max<int>((int *)((long)&__range1 + 4),&local_1cc);
        __range1._4_4_ = *(int *)local_2f8._0_8_;
        *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e63e;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&__end1);
      }
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e65a;
      github111116::ConsoleLogger::log<char[27],int>
                (&console,(char (*) [27])"max #blockers per cluster:",(int *)((long)&__range1 + 4));
      local_1d8 = (double)((local_1a8 * 10) /
                          (int)recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_) * 0.1;
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e6a1;
      github111116::ConsoleLogger::log<char[27],double>
                (&console,(char (*) [27])"avg #blockers per cluster:",&local_1d8);
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e6af;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_150);
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e6bb;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_f8);
      piStack_300 = (int *)0x18e6ce;
      std::vector<vec3f,_std::allocator<vec3f>_>::~vector
                ((vector<vec3f,_std::allocator<vec3f>_> *)local_88);
      piStack_300 = (int *)0x18e6d7;
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58)
      ;
      return;
    }
    local_2b8 = (SphereTree *)sphcnt_local;
    local_180 = local_208[blockers.
                          super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].z;
    local_188._0_4_ =
         local_208[blockers.
                   super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].x;
    local_188._4_4_ =
         local_208[blockers.
                   super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].y;
    sVar16 = (size_type)
             blockers.
             super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e1b8;
    pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_f8,sVar16);
    hierarchy_00 = local_2b8;
    cluster_radius_00 = *pvVar12;
    local_190 = local_180;
    _k = local_188;
    vVar17.z = local_180;
    vVar17.x = (data_t)(undefined4)local_188;
    vVar17.y = (data_t)local_188._4_4_;
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e209;
    treecut_ratio((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                   *)local_178,hierarchy_00,vVar17,cluster_radius_00,
                  (anonymous_namespace)::theta_max,(anonymous_namespace)::theta_min);
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e217;
    sVar16 = std::
             vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::size((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                     *)local_178);
    if ((0x400 < sVar16) ||
       (0x3ff < blockers.
                super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) break;
    recv_3 = 0;
    while( true ) {
      local_2c0 = (ulong)recv_3;
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e2c6;
      sVar16 = std::
               vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::size((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                       *)local_178);
      if (sVar16 <= local_2c0) break;
      local_2c8 = data + (blockers.
                          super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0xc);
      local_2d0 = (long)(recv_3 << 2);
      sVar16 = (size_type)recv_3;
      *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e322;
      pvVar14 = std::
                vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[]((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                              *)local_178,sVar16);
      dVar1 = (pvVar14->first).center.y;
      (local_2c8 + local_2d0)[0] = (pvVar14->first).center.x;
      (local_2c8 + local_2d0)[1] = dVar1;
      *(undefined8 *)(local_2c8 + local_2d0 + 2) = *(undefined8 *)&(pvVar14->first).center.z;
      for (s = 0; s < 0xf; s = s + 1) {
        sVar16 = (size_type)recv_3;
        *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e369;
        pvVar14 = std::
                  vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[]((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                                *)local_178,sVar16);
        sVar16 = (size_type)s;
        *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e37c;
        pvVar12 = std::vector<float,_std::allocator<float>_>::operator[](&pvVar14->second,sVar16);
        cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage
        [(s * 0x400 +
         blockers.
         super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) * 0x400 + recv_3] = *pvVar12;
      }
      recv_3 = recv_3 + 1;
    }
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e3da;
    sVar16 = std::
             vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::size((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                     *)local_178);
    local_2d8 = (float)(long)sVar16;
    local_2d4 = (float)sVar16;
    local_2dc = local_2d4;
    sVar16 = (size_type)
             blockers.
             super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e43e;
    pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_150,sVar16);
    *pvVar12 = local_2dc;
    *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e456;
    std::
    vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::~vector((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
               *)local_178);
    blockers.
    super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         blockers.
         super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  *(undefined8 *)((long)&piStack_300 + lVar5) = 0x18e235;
  puVar13 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar13 = "sphere texture overflowing";
  *(undefined **)((long)&piStack_300 + lVar5) = &UNK_0018e252;
  __cxa_throw(puVar13,&char_const*::typeinfo,0);
}

Assistant:

void cluster_preprocess(int n, const vec3f* positions, const int* clusterids, const SphereTree& hierarchy, int* sphcnt)
{
	console.log("per-cluster processing...");
	// calculate number of clusters
	int maxcluster = 0;
	for (int recv=0; recv<n; ++recv)
		maxcluster = std::max(maxcluster, clusterids[recv]);
	int n_cluster = maxcluster+1;
	// calculate centers of clusters (average over all receivers)
	std::vector<int> recv_cnt(n_cluster,0);
	std::vector<vec3f> recv_sum(n_cluster,0);
	for (int recv=0; recv<n; ++recv) {
		int c = clusterids[recv];
		recv_cnt[c] += 1;
		recv_sum[c] += positions[recv];
	}
	vec3f cluster_center[n_cluster];
	for (int c=0; c<n_cluster; ++c) {
		cluster_center[c] = recv_sum[c] / recv_cnt[c];
		if (recv_cnt[c] == 0) {
			console.debug("encountering empty receiver cluster");
			cluster_center[c] = vec3f(0,0,0);
		}
	}
	// calculate bounding radius of clusters
	std::vector<float> cluster_radius(n_cluster,0);
	for (int recv=0; recv<n; ++recv) {
		int c = clusterids[recv];
		cluster_radius[c] = std::max(cluster_radius[c], norm(positions[recv] - cluster_center[c]));
	}
	// prepare texture data
	static const int texwidth = 1024; // max number of spheres per cluster
	static const int texheight = 1024; // max number of cluster
	float* sphdata = new float[texheight * texwidth * 4];
	float* ratiodata = new float[shorder * texheight * texwidth];
	// assemble bounding sphere nodes for shading each cluster
	std::vector<float> cluster_blocker_count(n_cluster,0);
	for (int c=0; c<n_cluster; ++c) {
		// assemble blockers & calculate ratio vectors
		std::vector<std::pair<Sphere, std::vector<float>>> blockers
			= treecut_ratio(hierarchy, cluster_center[c], cluster_radius[c], theta_max, theta_min);
		if (blockers.size() > texwidth || c >= texheight)
			throw "sphere texture overflowing";
		// store into texture data
		for (int i=0; i<blockers.size(); ++i) {
			memcpy(sphdata + c*texwidth*4 + i*4, &blockers[i].first, sizeof(Sphere));
			for (int k=0; k<shorder; ++k)
				ratiodata[(k * texheight + c) * texwidth + i] = blockers[i].second[k];
		}
		cluster_blocker_count[c] = blockers.size();
	}
	// build texture
	glActiveTexture(GL_TEXTURE4);
	create_2D_float_texture(texwidth, texheight, 4, sphdata, GL_NEAREST);
	glActiveTexture(GL_TEXTURE5);
	create_2D_float_texture_array(texwidth, texheight, 1, shorder, ratiodata, GL_NEAREST);
	delete[] sphdata;
	delete[] ratiodata;
	// assign sphere count of each vertex
	for (int recv=0; recv<n; ++recv)
		sphcnt[recv] = cluster_blocker_count[clusterids[recv]];
	// show stats
	int s = 0, max = 0;
	for (int t: cluster_blocker_count) {
		s += t;
		max = std::max(max, t);
	}
	console.log("max #blockers per cluster:", max);
	console.log("avg #blockers per cluster:", 10 * s / n_cluster * 0.1);
}